

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

void __thiscall slang::SourceManager::SourceManager(SourceManager *this)

{
  unordered_flat_map<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>
  *in_RDI;
  FileInfo file;
  __integral_type __i;
  FileInfo *this_00;
  FileInfo *__args;
  size_t *this_01;
  
  std::shared_mutex::shared_mutex((shared_mutex *)0x2de2d1);
  std::shared_mutex::shared_mutex((shared_mutex *)0x2de2df);
  std::
  vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
  ::vector((vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
            *)0x2de2f2);
  boost::unordered::
  unordered_flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
              *)in_RDI);
  __i = (__integral_type)
        ((ulong)&(((table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
                    *)&in_RDI[3].table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
                  )->size_ctrl).size >> 0x20);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *)
         0x2de31f);
  this_00 = (FileInfo *)
            &(((table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
                *)&in_RDI[4].table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
              )->arrays).groups_;
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *)
         0x2de335);
  __args = (FileInfo *)
           &(((table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
               *)&in_RDI[4].table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
             )->size_ctrl).size;
  std::
  set<std::filesystem::__cxx11::path,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
  ::set((set<std::filesystem::__cxx11::path,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
         *)0x2de34b);
  this_01 = &in_RDI[5].table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
             .size_ctrl.size;
  boost::unordered::
  unordered_flat_map<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>
  ::unordered_flat_map(in_RDI);
  std::atomic<unsigned_int>::atomic((atomic<unsigned_int> *)this_00,__i);
  *(undefined1 *)
   ((long)&in_RDI[6].table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
           .size_ctrl.size + 4) = 0;
  FileInfo::FileInfo(this_00);
  std::
  vector<std::variant<slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>,std::allocator<std::variant<slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>>>
  ::emplace_back<slang::SourceManager::FileInfo&>
            ((vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
              *)this_01,__args);
  FileInfo::~FileInfo((FileInfo *)0x2de3ad);
  return;
}

Assistant:

SourceManager::SourceManager() {
    // add a dummy entry to the start of the directory list so that our file IDs line up
    FileInfo file;
    bufferEntries.emplace_back(file);
}